

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.h
# Opt level: O3

void __thiscall
mp::
ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
::
PropagateResult<mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::SinId>>
          (ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
           *this,CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::SinId>
                 *con,double lb,double ub,Context ctx)

{
  CtxVal CVar1;
  bool bVar2;
  
  CVar1 = (con->super_FunctionalConstraint).ctx.value_;
  if (CVar1 - CTX_ROOT < 2) {
    bVar2 = ctx.value_ - CTX_NEG < 2;
LAB_0023dae5:
    ctx.value_ = CTX_MIX;
    if (!bVar2) goto LAB_0023daef;
  }
  else if (CVar1 != CTX_NONE) {
    if ((CVar1 != CTX_NEG) || (CTX_MIX < ctx.value_)) goto LAB_0023daef;
    bVar2 = (0x16U >> (ctx.value_ & 0x1f) & 1) != 0;
    goto LAB_0023dae5;
  }
  (con->super_FunctionalConstraint).ctx.value_ = ctx.value_;
LAB_0023daef:
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::PropagateResultOfInitExpr
            ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              *)this,(con->
                     super_CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::SinId>
                     ).args_._M_elems[0],-INFINITY,INFINITY,(Context)0x4);
  return;
}

Assistant:

Context& Add(Context ct) {
    switch (value_) {          // Consider already stored value
    case CTX_NONE:
      value_ = ct.value_;
      break;
    case CTX_ROOT:
      MP_ASSERT(0, "Should not extend root context");
      [[fallthrough]];           // in release
    case CTX_POS:
      if (ct.HasNegative())
        value_ = CTX_MIX;
      break;
    case CTX_NEG:
      if (ct.HasPositive())
        value_ = CTX_MIX;
      break;
    default:
      break;
    }
    return *this;
  }